

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_parse_clienthello_tlsext(SSL_HANDSHAKE *hs,SSL_CLIENT_HELLO *client_hello)

{
  bool bVar1;
  int local_2c;
  SSL *pSStack_28;
  int alert;
  SSL *ssl;
  SSL_CLIENT_HELLO *client_hello_local;
  SSL_HANDSHAKE *hs_local;
  
  pSStack_28 = hs->ssl;
  local_2c = 0x32;
  ssl = (SSL *)client_hello;
  client_hello_local = (SSL_CLIENT_HELLO *)hs;
  bVar1 = ssl_scan_clienthello_tlsext(hs,client_hello,&local_2c);
  if (bVar1) {
    bVar1 = ssl_check_clienthello_tlsext((SSL_HANDSHAKE *)client_hello_local);
    if (bVar1) {
      hs_local._7_1_ = true;
    }
    else {
      ERR_put_error(0x10,0,0x84,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1002);
      hs_local._7_1_ = false;
    }
  }
  else {
    ssl_send_alert(pSStack_28,2,local_2c);
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_parse_clienthello_tlsext(SSL_HANDSHAKE *hs,
                                  const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  int alert = SSL_AD_DECODE_ERROR;
  if (!ssl_scan_clienthello_tlsext(hs, client_hello, &alert)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!ssl_check_clienthello_tlsext(hs)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_TLSEXT);
    return false;
  }

  return true;
}